

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedbuffer_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  bool bVar2;
  FixedBuffer<1024UL> local_410;
  
  local_410.m_pos = 0;
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    builtin_strncpy(local_410.m_buff + local_410.m_pos,"xiaocai",7);
    local_410.m_pos = local_410.m_pos + 7;
  }
  printBufferInfo<1024ul>(&local_410);
  builtin_strncpy(local_410.m_buff,"xiaofan",7);
  local_410.m_pos = 7;
  printBufferInfo<1024ul>(&local_410);
  return 0;
}

Assistant:

int main()
{
	FixedBuffer<1024> buffer;
	for (int i = 0; i < 10; ++i)
	{
		buffer.Append("xiaocai", 7);
	}
	printBufferInfo(buffer);
	
	buffer.Reset();
	buffer.Append("xiaofan", 7);
	printBufferInfo(buffer);
}